

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.c
# Opt level: O3

double * inform_integration_evidence_part
                   (int *series,size_t l,size_t n,int *b,size_t *parts,size_t nparts,
                   double *evidence,inform_error *err)

{
  undefined1 auVar1 [16];
  _Bool _Var2;
  inform_error iVar3;
  size_t *parts_00;
  int *series_00;
  double *pdVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar9 [16];
  double *local_38;
  long lVar8;
  
  if (series == (int *)0x0) {
    iVar3 = INFORM_ETIMESERIES;
  }
  else {
    if (1 < l) {
      local_38 = evidence;
      if ((evidence == (double *)0x0) &&
         (local_38 = (double *)malloc(n << 4), local_38 == (double *)0x0)) {
        if (err == (inform_error *)0x0) {
          return (double *)0x0;
        }
        *err = INFORM_ENOMEM;
        return (double *)0x0;
      }
      parts_00 = parts;
      if (parts == (size_t *)0x0) {
        parts_00 = (size_t *)malloc(l * 8);
        auVar1 = _DAT_0010a080;
        if (parts_00 == (size_t *)0x0) {
          if (evidence == (double *)0x0) {
            free(local_38);
          }
          if (err == (inform_error *)0x0) {
            return (double *)0x0;
          }
          *err = INFORM_ENOMEM;
          return (double *)0x0;
        }
        lVar8 = l - 1;
        auVar6._8_4_ = (int)lVar8;
        auVar6._0_8_ = lVar8;
        auVar6._12_4_ = (int)((ulong)lVar8 >> 0x20);
        uVar5 = 0;
        auVar6 = auVar6 ^ _DAT_0010a080;
        auVar7 = _DAT_0010a070;
        do {
          auVar9 = auVar7 ^ auVar1;
          if ((bool)(~(auVar9._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar9._0_4_ ||
                      auVar6._4_4_ < auVar9._4_4_) & 1)) {
            parts_00[uVar5] = uVar5;
          }
          if ((auVar9._12_4_ != auVar6._12_4_ || auVar9._8_4_ <= auVar6._8_4_) &&
              auVar9._12_4_ <= auVar6._12_4_) {
            parts_00[uVar5 + 1] = uVar5 + 1;
          }
          uVar5 = uVar5 + 2;
          lVar8 = auVar7._8_8_;
          auVar7._0_8_ = auVar7._0_8_ + 2;
          auVar7._8_8_ = lVar8 + 2;
          nparts = l;
        } while ((l + 1 & 0xfffffffffffffffe) != uVar5);
      }
      series_00 = inform_black_box_parts(series,l,n,b,parts_00,nparts,(int *)0x0,err);
      _Var2 = inform_succeeded(err);
      if (_Var2) {
        inform_local_mutual_info(series_00,nparts,n,series_00 + nparts * n,local_38,err);
      }
      free(series_00);
      if (parts == (size_t *)0x0) {
        free(parts_00);
      }
      _Var2 = inform_failed(err);
      pdVar4 = (double *)0x0;
      if (!_Var2) {
        pdVar4 = local_38;
      }
      if (_Var2 && evidence == (double *)0x0) {
        free(local_38);
        return (double *)0x0;
      }
      return pdVar4;
    }
    iVar3 = INFORM_ENOSOURCES;
  }
  if (err != (inform_error *)0x0) {
    *err = iVar3;
  }
  return (double *)0x0;
}

Assistant:

double *inform_integration_evidence_part(int const *series, size_t l, size_t n,
    int const *b, size_t const *parts, size_t nparts, double *evidence,
    inform_error *err)
{
    if (check_arguments(series, l, err))
    {
        return NULL;
    }
    int allocate_evidence = (evidence == NULL);
    if (allocate_evidence)
    {
        evidence = malloc(2 * n * sizeof(double));
        if (evidence == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    size_t *partitioning = (size_t *)parts;
    int allocate_parts = (partitioning == NULL);
    if (allocate_parts)
    {
        partitioning = malloc(l * sizeof(size_t));
        if (partitioning == NULL)
        {
            if (allocate_evidence) free(evidence);
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
        for (size_t i = 0; i < l; ++i) partitioning[i] = i;
        nparts = l;
    }
    int *partitioned = inform_black_box_parts(series, l, n, b, partitioning,
        nparts, NULL, err);
    if (inform_succeeded(err))
    {
        inform_local_mutual_info(partitioned, nparts, n, partitioned + nparts*n,
            evidence, err);
    }
    free(partitioned);
    if (allocate_parts) free(partitioning);
    if (inform_failed(err))
    {
        if (allocate_evidence) free(evidence);
        return NULL;
    }
    return evidence;
}